

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

void __thiscall QRegularExpression::setPattern(QRegularExpression *this,QString *pattern)

{
  QRegularExpressionPrivate *pQVar1;
  bool bVar2;
  
  bVar2 = ::comparesEqual(&((this->d).d.ptr)->pattern,pattern);
  if (bVar2) {
    return;
  }
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::detach(&this->d);
  pQVar1 = (this->d).d.ptr;
  pQVar1->isDirty = true;
  QString::operator=(&pQVar1->pattern,pattern);
  return;
}

Assistant:

void QRegularExpression::setPattern(const QString &pattern)
{
    if (d->pattern == pattern)
        return;
    d.detach();
    d->isDirty = true;
    d->pattern = pattern;
}